

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void printopaquemem(MCInst *MI,uint OpNo,SStream *O)

{
  cs_mode cVar1;
  uint8_t uVar2;
  uint uVar3;
  
  uVar3 = MI->flat_insn->id;
  if ((int)uVar3 < 0x147) {
    if ((0x26 < uVar3 - 0x9a) || ((0x5000000003U >> ((ulong)(uVar3 - 0x9a) & 0x3f) & 1) == 0))
    goto LAB_0023a6ba;
  }
  else if ((int)uVar3 < 0x283) {
    if ((uVar3 != 0x147) && (uVar3 != 0x149)) {
LAB_0023a6ba:
      SStream_concat0(O,"ptr ");
    }
  }
  else if ((uVar3 != 0x283) && (uVar3 != 0x293)) goto LAB_0023a6ba;
  cVar1 = MI->csh->mode;
  if (cVar1 == CS_MODE_64) {
    uVar3 = MI->flat_insn->id;
    uVar2 = '\b';
    if ((int)uVar3 < 0x149) {
      if ((uVar3 - 0x9a < 2) || (uVar3 == 0x147)) {
LAB_0023a795:
        uVar2 = '\n';
      }
    }
    else if (((uVar3 == 0x149) || (uVar3 == 0x293)) || (uVar3 == 0x283)) goto LAB_0023a795;
  }
  else if (cVar1 == CS_MODE_32) {
    uVar3 = MI->flat_insn->id;
    uVar2 = '\x04';
    if ((int)uVar3 < 0x149) {
      uVar2 = '\x04';
      if (1 < uVar3 - 0x9a) {
LAB_0023a731:
        if (uVar3 != 0x147) goto LAB_0023a7b3;
      }
    }
    else if (((uVar3 != 0x149) && (uVar3 != 0x293)) && (uVar3 != 0x283)) goto LAB_0023a7b3;
LAB_0023a7b1:
    uVar2 = '\x06';
  }
  else {
    if (cVar1 != CS_MODE_16) goto LAB_0023a7ba;
    uVar3 = MI->flat_insn->id;
    uVar2 = '\x02';
    if ((int)uVar3 < 0x149) {
      uVar2 = '\x02';
      if (1 < uVar3 - 0x9a) goto LAB_0023a731;
      uVar2 = '\x04';
    }
    else if (((uVar3 == 0x149) || (uVar3 == 0x283)) || (uVar3 == 0x293)) goto LAB_0023a7b1;
  }
LAB_0023a7b3:
  MI->x86opsize = uVar2;
LAB_0023a7ba:
  printMemReference(MI,OpNo,O);
  return;
}

Assistant:

static void printopaquemem(MCInst *MI, unsigned OpNo, SStream *O)
{
	switch(MI->csh->mode) {
		case CS_MODE_16:
			switch(MI->flat_insn->id) {
				default:
					MI->x86opsize = 2;
					break;
				case X86_INS_LJMP:
				case X86_INS_LCALL:
					MI->x86opsize = 4;
					break;
				case X86_INS_SGDT:
				case X86_INS_SIDT:
				case X86_INS_LGDT:
				case X86_INS_LIDT:
					MI->x86opsize = 6;
					break;
			}
			break;
		case CS_MODE_32:
			switch(MI->flat_insn->id) {
				default:
					MI->x86opsize = 4;
					break;
				case X86_INS_LJMP:
				case X86_INS_LCALL:
				case X86_INS_SGDT:
				case X86_INS_SIDT:
				case X86_INS_LGDT:
				case X86_INS_LIDT:
					MI->x86opsize = 6;
					break;
			}
			break;
		case CS_MODE_64:
			switch(MI->flat_insn->id) {
				default:
					MI->x86opsize = 8;
					break;
				case X86_INS_LJMP:
				case X86_INS_LCALL:
				case X86_INS_SGDT:
				case X86_INS_SIDT:
				case X86_INS_LGDT:
				case X86_INS_LIDT:
					MI->x86opsize = 10;
					break;
			}
			break;
		default:	// never reach
			break;
	}

	printMemReference(MI, OpNo, O);
}